

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CheckerDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::AssertionItemPortListSyntax*&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,AssertionItemPortListSyntax **args_3,Token *args_4,
          SyntaxList<slang::syntax::MemberSyntax> *args_5,Token *args_6,
          NamedBlockClauseSyntax **args_7)

{
  Token name;
  Token keyword;
  Token semi;
  Token end;
  CheckerDeclarationSyntax *this_00;
  
  this_00 = (CheckerDeclarationSyntax *)allocate(this,0xd8,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  end.kind = args_6->kind;
  end._2_1_ = args_6->field_0x2;
  end.numFlags.raw = (args_6->numFlags).raw;
  end.rawLen = args_6->rawLen;
  end.info = args_6->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::CheckerDeclarationSyntax::CheckerDeclarationSyntax
            (this_00,args,keyword,name,*args_3,semi,args_5,end,*args_7);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }